

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls13_enc.cc
# Opt level: O3

bool __thiscall
bssl::tls13_advance_key_schedule(bssl *this,SSL_HANDSHAKE *hs,Span<const_unsigned_char> in)

{
  SSL_HANDSHAKE *hs_00;
  bssl bVar1;
  string_view label;
  Span<const_unsigned_char> hash;
  bool bVar2;
  int iVar3;
  EVP_MD *type;
  EVP_MD *digest;
  Span<const_unsigned_char> secret;
  Span<const_unsigned_char> in_00;
  Span<unsigned_char> out;
  uint derive_context_len;
  uint8_t derive_context [64];
  uint local_b4;
  SSL_HANDSHAKE *local_b0;
  uchar *local_a8;
  ulong local_a0;
  uchar *local_98;
  size_t sStack_90;
  size_t local_88;
  char *pcStack_80;
  uchar local_78 [72];
  ulong uVar4;
  
  hs_00 = (SSL_HANDSHAKE *)(this + 0x208);
  type = (EVP_MD *)SSLTranscript::Digest((SSLTranscript *)hs_00);
  bVar2 = false;
  iVar3 = EVP_Digest((void *)0x0,0,local_78,&local_b4,type,(ENGINE *)0x0);
  if (iVar3 != 0) {
    local_a0 = (ulong)(byte)this[0x60];
    local_b0 = hs;
    local_a8 = in.data_;
    digest = SSLTranscript::Digest((SSLTranscript *)hs_00);
    bVar1 = this[0x60];
    local_88 = 7;
    pcStack_80 = "derived";
    sStack_90 = (size_t)local_b4;
    local_98 = local_78;
    iVar3 = SSL_is_dtls(*(SSL **)this);
    label._M_str = pcStack_80;
    label._M_len = local_88;
    hash.size_ = sStack_90;
    hash.data_ = local_98;
    secret.size_._0_1_ = bVar1;
    secret.data_ = (uchar *)(this + 0x20);
    secret.size_._1_7_ = 0;
    uVar4 = (ulong)(byte)bVar1;
    out.size_ = local_a0;
    out.data_ = (uchar *)(this + 0x20);
    bVar2 = hkdf_expand_label(out,digest,secret,label,hash,iVar3 != 0);
    if (bVar2) {
      in_00.size_ = uVar4;
      in_00.data_ = local_a8;
      bVar2 = hkdf_extract_to_secret(this,hs_00,(SSLTranscript *)local_b0,in_00);
    }
    else {
      bVar2 = false;
    }
  }
  return bVar2;
}

Assistant:

bool tls13_advance_key_schedule(SSL_HANDSHAKE *hs, Span<const uint8_t> in) {
  uint8_t derive_context[EVP_MAX_MD_SIZE];
  unsigned derive_context_len;
  return EVP_Digest(nullptr, 0, derive_context, &derive_context_len,
                    hs->transcript.Digest(), nullptr) &&
         hkdf_expand_label(Span(hs->secret), hs->transcript.Digest(),
                           hs->secret, kTLS13LabelDerived,
                           Span(derive_context, derive_context_len),
                           SSL_is_dtls(hs->ssl)) &&
         hkdf_extract_to_secret(hs, hs->transcript, in);
}